

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O3

void mouseScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  ImGuiIO *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar1 = ImGui::GetIO();
  ImGui_ImplGlfw_ScrollCallback(window,xoffset,yoffset);
  if (pIVar1->WantCaptureMouse == false) {
    fVar2 = (float)yoffset;
    fVar3 = g_camera.pos.x;
    fVar4 = g_camera.pos.y;
    fVar5 = SQRT(g_camera.pos.z * g_camera.pos.z + fVar3 * fVar3 + fVar4 * fVar4);
    g_camera.pos.y = fVar5 * fVar2 * g_camera.axis.m[1].x * -0.05 + fVar4;
    g_camera.pos.x = fVar5 * fVar2 * g_camera.axis.m[0].x * -0.05 + fVar3;
    g_camera.pos.z = g_camera.axis.m[2].x * fVar2 * -0.05 * fVar5 + g_camera.pos.z;
    g_framebuffer.flags.reset = true;
  }
  return;
}

Assistant:

void mouseScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_ScrollCallback(window, xoffset, yoffset);
    if (io.WantCaptureMouse)
        return;

    dja::mat3 axis = dja::transpose(g_camera.axis);
    g_camera.pos-= axis[0] * yoffset * 5e-2 * norm(g_camera.pos);
    g_framebuffer.flags.reset = true;
}